

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockPluginTest.cpp
# Opt level: O0

void __thiscall
TEST_MockPlugin_installComparatorRecordsTheComparatorButNotInstallsItYet_Test::
~TEST_MockPlugin_installComparatorRecordsTheComparatorButNotInstallsItYet_Test
          (TEST_MockPlugin_installComparatorRecordsTheComparatorButNotInstallsItYet_Test *this)

{
  TEST_MockPlugin_installComparatorRecordsTheComparatorButNotInstallsItYet_Test *this_local;
  
  ~TEST_MockPlugin_installComparatorRecordsTheComparatorButNotInstallsItYet_Test(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

TEST(MockPlugin, installComparatorRecordsTheComparatorButNotInstallsItYet)
{
    MockFailureReporterInstaller failureReporterInstaller;

    DummyComparator comparator;
    plugin.installComparator("myType", comparator);
    mock().expectOneCall("foo").withParameterOfType("myType", "name", NULLPTR);
    mock().actualCall("foo").withParameterOfType("myType", "name", NULLPTR);

    MockNoWayToCompareCustomTypeFailure failure(test, "myType");
    CHECK_EXPECTED_MOCK_FAILURE(failure);

    plugin.clear();
}